

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O1

int Bac_ManBoxNum_rec(Bac_Ntk_t *p)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Bac_Ntk_t *p_00;
  long lVar4;
  
  iVar3 = p->Count;
  if (iVar3 < 0) {
    if ((p->vType).nSize < 1) {
      iVar3 = 0;
    }
    else {
      lVar4 = 0;
      iVar3 = 0;
      do {
        bVar1 = (p->vType).pArray[lVar4];
        if (0xffffffbb < (bVar1 >> 1) - 0x49) {
          iVar2 = 1;
          if ((bVar1 & 0xfe) == 10) {
            if (bVar1 < 10) {
              __assert_fail("Bac_ObjIsBox(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                            ,0x13d,"int Bac_BoxNtkId(Bac_Ntk_t *, int)");
            }
            if ((p->vFanin).nSize <= lVar4) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar2 = (p->vFanin).pArray[lVar4];
            if (((long)iVar2 < 1) || (p->pDesign->nNtks < iVar2)) {
              p_00 = (Bac_Ntk_t *)0x0;
            }
            else {
              p_00 = p->pDesign->pNtks + iVar2;
            }
            iVar2 = Bac_ManBoxNum_rec(p_00);
          }
          iVar3 = iVar3 + iVar2;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (p->vType).nSize);
    }
    p->Count = iVar3;
  }
  return iVar3;
}

Assistant:

static inline int Bac_ManBoxNum_rec( Bac_Ntk_t * p )
{
    int iObj, Counter = 0;
    if ( p->Count >= 0 )
        return p->Count;
    Bac_NtkForEachBox( p, iObj )
        Counter += Bac_ObjIsBoxUser(p, iObj) ? Bac_ManBoxNum_rec( Bac_BoxNtk(p, iObj) ) : 1;
    return (p->Count = Counter);
}